

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O1

void __thiscall chrono::ChContinuumSPH::ArchiveOUT(ChContinuumSPH *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChContinuumSPH>(marchive);
  fea::ChContinuumMaterial::ArchiveOUT(&this->super_ChContinuumMaterial,marchive);
  local_30 = &this->viscosity;
  local_38 = "viscosity";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->surface_tension;
  local_38 = "surface_tension";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->pressure_stiffness;
  local_38 = "pressure_stiffness";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ChContinuumSPH::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChContinuumSPH>();

    // serialize parent class
    ChContinuumMaterial::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(viscosity);
    marchive << CHNVP(surface_tension);
    marchive << CHNVP(pressure_stiffness);
}